

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip_x86.cpp
# Opt level: O0

int __thiscall ncnn::Clip_x86::forward_inplace(Clip_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 (*pauVar2) [16];
  float *pfVar3;
  long in_RSI;
  long *in_RDI;
  undefined1 auVar4 [16];
  int remain;
  float *ptr_1;
  int q_1;
  __m128 _ptr;
  int i;
  __m128 _min;
  __m128 _max;
  float *ptr;
  int q;
  int elempack;
  int size;
  int channels;
  int h;
  int w;
  undefined4 in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe2c;
  Mat local_1d0;
  float *local_188;
  int local_17c;
  undefined1 local_178 [16];
  int local_15c;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  Mat local_120;
  undefined1 (*local_d8) [16];
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 local_64;
  undefined1 (*local_60) [16];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  undefined1 (*local_8) [16];
  
  local_bc = *(int *)(in_RSI + 0x2c);
  local_c0 = *(int *)(in_RSI + 0x30);
  local_c4 = *(int *)(in_RSI + 0x38);
  local_c8 = local_bc * local_c0;
  local_cc = *(int *)(in_RSI + 0x18);
  if (local_cc == 4) {
    local_cc = 4;
    for (local_d0 = 0; local_d0 < local_c4; local_d0 = local_d0 + 1) {
      ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                         (int)((ulong)in_RDI >> 0x20));
      pauVar2 = (undefined1 (*) [16])ncnn::Mat::operator_cast_to_float_(&local_120);
      ncnn::Mat::~Mat((Mat *)0x6bd306);
      local_78 = *(undefined4 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
      local_148 = CONCAT44(local_78,local_78);
      uStack_140 = CONCAT44(local_78,local_78);
      local_98 = *(undefined4 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
      local_158 = CONCAT44(local_98,local_98);
      uStack_150 = CONCAT44(local_98,local_98);
      local_d8 = pauVar2;
      for (local_15c = 0; local_15c < local_c8; local_15c = local_15c + 1) {
        local_60 = local_d8;
        local_48 = *(undefined8 *)*local_d8;
        uStack_40 = *(undefined8 *)(*local_d8 + 8);
        auVar4._8_8_ = uStack_150;
        auVar4._0_8_ = local_158;
        auVar4 = maxps(*local_d8,auVar4);
        local_178._0_8_ = auVar4._0_8_;
        local_28 = local_178._0_8_;
        local_178._8_8_ = auVar4._8_8_;
        uStack_20 = local_178._8_8_;
        auVar1._8_8_ = uStack_140;
        auVar1._0_8_ = local_148;
        local_178 = minps(auVar4,auVar1);
        local_8 = local_d8;
        local_18 = local_178._0_8_;
        uStack_10 = local_178._8_8_;
        *(undefined8 *)*local_d8 = local_178._0_8_;
        *(undefined8 *)(*local_d8 + 8) = local_178._8_8_;
        local_d8 = local_d8 + 1;
        local_58 = local_158;
        uStack_50 = uStack_150;
        local_38 = local_148;
        uStack_30 = uStack_140;
      }
      uStack_94 = local_98;
      uStack_90 = local_98;
      uStack_8c = local_98;
      local_88 = local_98;
      uStack_74 = local_78;
      uStack_70 = local_78;
      uStack_6c = local_78;
      local_64 = local_78;
    }
  }
  else {
    for (local_17c = 0; local_17c < local_c4; local_17c = local_17c + 1) {
      ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                         (int)((ulong)in_RDI >> 0x20));
      pfVar3 = ncnn::Mat::operator_cast_to_float_(&local_1d0);
      ncnn::Mat::~Mat((Mat *)0x6bd54e);
      local_188 = pfVar3;
      for (in_stack_fffffffffffffe2c = local_c8; 0 < in_stack_fffffffffffffe2c;
          in_stack_fffffffffffffe2c = in_stack_fffffffffffffe2c + -1) {
        if (*local_188 < *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0)) {
          *local_188 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
        }
        pfVar3 = (float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
        if (*pfVar3 <= *local_188 && *local_188 != *pfVar3) {
          *local_188 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
        }
        local_188 = local_188 + 1;
      }
    }
  }
  return 0;
}

Assistant:

int Clip_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            __m256 _max = _mm256_set1_ps(max);
            __m256 _min = _mm256_set1_ps(min);

            for (int i = 0; i < size; i++)
            {
                __m256 _ptr = _mm256_loadu_ps(ptr);
                _ptr = _mm256_max_ps(_ptr, _min);
                _ptr = _mm256_min_ps(_ptr, _max);
                _mm256_storeu_ps(ptr, _ptr);

                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            __m128 _max = _mm_set1_ps(max);
            __m128 _min = _mm_set1_ps(min);

            for (int i = 0; i < size; i++)
            {
                __m128 _ptr = _mm_loadu_ps(ptr);
                _ptr = _mm_max_ps(_ptr, _min);
                _ptr = _mm_min_ps(_ptr, _max);
                _mm_storeu_ps(ptr, _ptr);

                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int remain = size;
        for (; remain > 0; remain--)
        {
            if (*ptr < min)
                *ptr = min;

            if (*ptr > max)
                *ptr = max;

            ptr++;
        }
    }

    return 0;
}